

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLValidityCodes.hpp
# Opt level: O2

ErrTypes xercesc_4_0::XMLValid::errorType(Codes toCheck)

{
  if ((toCheck & ~E_LowBounds) == W_LowBounds) {
    return ErrType_Warning;
  }
  if ((toCheck & ~E_LowBounds) == F_LowBounds) {
    return ErrType_Fatal;
  }
  return (uint)(0x4e < toCheck - E_LowBounds) * 2 + ErrType_Error;
}

Assistant:

static XMLErrorReporter::ErrTypes errorType(const XMLValid::Codes toCheck)
    {
       if ((toCheck >= W_LowBounds) && (toCheck <= W_HighBounds))
           return XMLErrorReporter::ErrType_Warning;
       else if ((toCheck >= F_LowBounds) && (toCheck <= F_HighBounds))
            return XMLErrorReporter::ErrType_Fatal;
       else if ((toCheck >= E_LowBounds) && (toCheck <= E_HighBounds))
            return XMLErrorReporter::ErrType_Error;
       return XMLErrorReporter::ErrTypes_Unknown;
    }